

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error doContent(XML_Parser parser,int startTagLevel,ENCODING *enc,char *s,char *end,
                   char **nextPtr,XML_Bool haveMore)

{
  char cVar1;
  XML_Parsing XVar2;
  XML_DefaultHandler p_Var3;
  block *pbVar4;
  binding *pbVar5;
  DTD *pDVar6;
  int iVar7;
  XML_Convert_Result XVar8;
  XML_Error XVar9;
  char *pcVar10;
  XML_EndElementHandler p_Var11;
  TAG *pTVar12;
  XML_Char *pXVar13;
  ENTITY *entity;
  char *pcVar14;
  BLOCK *pBVar15;
  BINDING *pBVar16;
  XML_Bool betweenDecl;
  BLOCK *pBVar17;
  BINDING *b;
  BINDING *pBVar18;
  TAG_NAME *pTVar19;
  void *pvVar20;
  XML_CharacterDataHandler p_Var21;
  size_t sVar22;
  OPEN_INTERNAL_ENTITY *pOVar23;
  char *fromPtr;
  TAG_NAME name;
  TAG_NAME *local_b8;
  TAG_NAME *local_b0;
  OPEN_INTERNAL_ENTITY *local_a8;
  TAG_NAME *local_a0;
  int local_94;
  BINDING *local_90;
  char **local_88;
  TAG_NAME local_80;
  char **local_58;
  XML_Char **local_50;
  STRING_POOL *local_48;
  DTD *local_40;
  STRING_POOL *local_38;
  
  local_40 = parser->m_dtd;
  if (parser->m_encoding == enc) {
    pOVar23 = (OPEN_INTERNAL_ENTITY *)&parser->m_eventPtr;
    local_88 = &parser->m_eventEndPtr;
  }
  else {
    pOVar23 = parser->m_openInternalEntities;
    local_88 = &pOVar23->internalEventEndPtr;
  }
  pOVar23->internalEventPtr = s;
  local_48 = &parser->m_tempPool;
  local_50 = &(parser->m_tempPool).end;
  local_38 = &local_40->pool;
  local_b8 = (TAG_NAME *)s;
  local_a8 = pOVar23;
  local_a0 = (TAG_NAME *)end;
  local_94 = startTagLevel;
  do {
    local_b0 = local_b8;
    iVar7 = (*enc->scanners[1])(enc,(char *)local_b8,(char *)local_a0,(char **)&local_b0);
    *local_88 = (char *)local_b0;
    switch(iVar7) {
    case 0:
      pOVar23->internalEventPtr = (char *)local_b0;
      return XML_ERROR_INVALID_TOKEN;
    case 1:
    case 2:
      pTVar12 = parser->m_freeTagList;
      local_58 = nextPtr;
      if (pTVar12 == (TAG *)0x0) {
        pTVar12 = (TAG *)(*(parser->m_mem).malloc_fcn)(0x58);
        if (pTVar12 == (TAG *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pcVar14 = (char *)(*(parser->m_mem).malloc_fcn)(0x20);
        pTVar12->buf = pcVar14;
        if (pcVar14 == (char *)0x0) {
          (*(parser->m_mem).free_fcn)(pTVar12);
          return XML_ERROR_NO_MEMORY;
        }
        pTVar12->bufEnd = pcVar14 + 0x20;
      }
      else {
        parser->m_freeTagList = pTVar12->parent;
      }
      pTVar12->bindings = (BINDING *)0x0;
      pTVar12->parent = parser->m_tagStack;
      parser->m_tagStack = pTVar12;
      (pTVar12->name).localPart = (XML_Char *)0x0;
      (pTVar12->name).prefix = (XML_Char *)0x0;
      pcVar14 = (char *)((long)&local_b8->str + (long)enc->minBytesPerChar);
      pTVar12->rawName = pcVar14;
      iVar7 = (*enc->nameLength)(enc,pcVar14);
      pTVar12->rawNameLength = iVar7;
      parser->m_tagLevel = parser->m_tagLevel + 1;
      local_90 = (BINDING *)pTVar12->rawName;
      pBVar18 = (BINDING *)((long)&local_90->prefix + (long)iVar7);
      local_80.str = pTVar12->buf;
      pcVar14 = pTVar12->bufEnd;
      while( true ) {
        XVar8 = (*enc->utf8Convert)(enc,(char **)&local_90,(char *)pBVar18,&local_80.str,
                                    pcVar14 + -1);
        pcVar14 = pTVar12->buf;
        iVar7 = (int)local_80.str - (int)pcVar14;
        if ((pBVar18 <= local_90) || (XVar8 == XML_CONVERT_INPUT_INCOMPLETE)) break;
        sVar22 = (size_t)((*(int *)&pTVar12->bufEnd - (int)pcVar14) * 2);
        pcVar14 = (char *)(*(parser->m_mem).realloc_fcn)(pcVar14,sVar22);
        if (pcVar14 == (char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        pTVar12->buf = pcVar14;
        pTVar12->bufEnd = pcVar14 + sVar22;
        local_80.str = pcVar14 + iVar7;
        pcVar14 = pcVar14 + sVar22;
      }
      (pTVar12->name).strLen = iVar7;
      (pTVar12->name).str = pcVar14;
      *local_80.str = '\0';
      XVar9 = storeAtts(parser,enc,(char *)local_b8,&pTVar12->name,&pTVar12->bindings);
      nextPtr = local_58;
      pOVar23 = local_a8;
      if (XVar9 != XML_ERROR_NONE) {
        return XVar9;
      }
      if (parser->m_startElementHandler == (XML_StartElementHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,(char *)local_b8,(char *)local_b0);
        }
      }
      else {
        (*parser->m_startElementHandler)
                  (parser->m_handlerArg,(pTVar12->name).str,&parser->m_atts->name);
        nextPtr = local_58;
        pOVar23 = local_a8;
      }
      pBVar17 = (parser->m_tempPool).blocks;
      pBVar15 = (parser->m_tempPool).freeBlocks;
      if (pBVar15 == (BLOCK *)0x0) {
LAB_00456951:
        (parser->m_tempPool).freeBlocks = pBVar17;
      }
      else {
        pbVar4 = pBVar17;
        if (pBVar17 != (BLOCK *)0x0) {
          do {
            pBVar17 = pbVar4;
            pbVar4 = pBVar17->next;
            pBVar17->next = pBVar15;
            pBVar15 = pBVar17;
          } while (pbVar4 != (block *)0x0);
          goto LAB_00456951;
        }
      }
      local_48->blocks = (BLOCK *)0x0;
      local_50[2] = (XML_Char *)0x0;
      *local_50 = (XML_Char *)0x0;
      local_50[1] = (XML_Char *)0x0;
      break;
    case 3:
    case 4:
      pcVar14 = (char *)((long)&local_b8->str + (long)enc->minBytesPerChar);
      local_90 = (BINDING *)0x0;
      iVar7 = (*enc->nameLength)(enc,pcVar14);
      local_80.str = poolStoreString(local_48,enc,pcVar14,pcVar14 + iVar7);
      if (local_80.str == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
      XVar9 = storeAtts(parser,enc,(char *)local_b8,&local_80,&local_90);
      if (XVar9 != XML_ERROR_NONE) {
        freeBindings(parser,local_90);
        return XVar9;
      }
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
      if (parser->m_startElementHandler == (XML_StartElementHandler)0x0) {
        p_Var11 = parser->m_endElementHandler;
        if (p_Var11 != (XML_EndElementHandler)0x0) goto LAB_0045687b;
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,(char *)local_b8,(char *)local_b0);
        }
      }
      else {
        (*parser->m_startElementHandler)(parser->m_handlerArg,local_80.str,&parser->m_atts->name);
        p_Var11 = parser->m_endElementHandler;
        if (p_Var11 != (XML_EndElementHandler)0x0) {
          if (parser->m_startElementHandler != (XML_StartElementHandler)0x0) {
            pOVar23->internalEventPtr = *local_88;
            p_Var11 = parser->m_endElementHandler;
          }
LAB_0045687b:
          (*p_Var11)(parser->m_handlerArg,local_80.str);
        }
      }
      pBVar17 = (parser->m_tempPool).blocks;
      pBVar15 = (parser->m_tempPool).freeBlocks;
      if (pBVar15 == (BLOCK *)0x0) {
LAB_004568b4:
        (parser->m_tempPool).freeBlocks = pBVar17;
      }
      else {
        pbVar4 = pBVar17;
        if (pBVar17 != (BLOCK *)0x0) {
          do {
            pBVar17 = pbVar4;
            pbVar4 = pBVar17->next;
            pBVar17->next = pBVar15;
            pBVar15 = pBVar17;
          } while (pbVar4 != (block *)0x0);
          goto LAB_004568b4;
        }
      }
      (parser->m_tempPool).blocks = (BLOCK *)0x0;
      local_50[2] = (XML_Char *)0x0;
      *local_50 = (XML_Char *)0x0;
      local_50[1] = (XML_Char *)0x0;
      freeBindings(parser,local_90);
      if (parser->m_tagLevel == 0) {
        XVar2 = (parser->m_parsingStatus).parsing;
        if (XVar2 != XML_SUSPENDED) {
          if (XVar2 == XML_FINISHED) {
            pOVar23->internalEventPtr = (char *)local_b0;
            return XML_ERROR_ABORTED;
          }
LAB_00456d0b:
          XVar9 = epilogProcessor(parser,(char *)local_b0,(char *)local_a0,nextPtr);
          return XVar9;
        }
        parser->m_processor = epilogProcessor;
        pOVar23->internalEventPtr = (char *)local_b0;
        local_b8 = local_b0;
        goto LAB_00456df2;
      }
      break;
    case 5:
      if (parser->m_tagLevel == local_94) {
        return XML_ERROR_ASYNC_ENTITY;
      }
      pTVar12 = parser->m_tagStack;
      parser->m_tagStack = pTVar12->parent;
      pTVar12->parent = parser->m_freeTagList;
      parser->m_freeTagList = pTVar12;
      pcVar14 = (char *)((long)&local_b8->str + (long)enc->minBytesPerChar * 2);
      iVar7 = (*enc->nameLength)(enc,pcVar14);
      if ((iVar7 != pTVar12->rawNameLength) ||
         (iVar7 = bcmp(pTVar12->rawName,pcVar14,(long)iVar7), iVar7 != 0)) {
        local_a8->internalEventPtr = pcVar14;
        return XML_ERROR_TAG_MISMATCH;
      }
      parser->m_tagLevel = parser->m_tagLevel + -1;
      p_Var11 = parser->m_endElementHandler;
      if (p_Var11 == (XML_EndElementHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,(char *)local_b8,(char *)local_b0);
        }
      }
      else {
        pcVar14 = (pTVar12->name).localPart;
        if (pcVar14 != (char *)0x0 && parser->m_ns != '\0') {
          pcVar10 = (pTVar12->name).str + (pTVar12->name).uriLen;
          cVar1 = *pcVar14;
          while (cVar1 != '\0') {
            pcVar14 = pcVar14 + 1;
            *pcVar10 = cVar1;
            pcVar10 = pcVar10 + 1;
            cVar1 = *pcVar14;
          }
          pcVar14 = (pTVar12->name).prefix;
          if (pcVar14 != (char *)0x0 && parser->m_ns_triplets != '\0') {
            *pcVar10 = parser->m_namespaceSeparator;
            cVar1 = *pcVar14;
            while (pcVar10 = pcVar10 + 1, cVar1 != '\0') {
              pcVar14 = pcVar14 + 1;
              *pcVar10 = cVar1;
              cVar1 = *pcVar14;
            }
          }
          *pcVar10 = '\0';
          p_Var11 = parser->m_endElementHandler;
        }
        (*p_Var11)(parser->m_handlerArg,(pTVar12->name).str);
      }
      pBVar18 = pTVar12->bindings;
      while (pBVar18 != (BINDING *)0x0) {
        pBVar16 = pBVar18;
        if (parser->m_endNamespaceDeclHandler != (XML_EndNamespaceDeclHandler)0x0) {
          (*parser->m_endNamespaceDeclHandler)(parser->m_handlerArg,pBVar18->prefix->name);
          pBVar16 = pTVar12->bindings;
        }
        pbVar5 = pBVar16->nextTagBinding;
        pTVar12->bindings = pbVar5;
        pBVar18->nextTagBinding = parser->m_freeBindingList;
        parser->m_freeBindingList = pBVar18;
        pBVar18->prefix->binding = pBVar18->prevPrefixBinding;
        pBVar18 = pbVar5;
      }
      pOVar23 = local_a8;
      if (parser->m_tagLevel == 0) goto LAB_00456d0b;
      break;
    case 6:
      p_Var21 = parser->m_characterDataHandler;
      if (p_Var21 == (XML_CharacterDataHandler)0x0) {
        pOVar23 = local_a8;
        if (parser->m_defaultHandler == (XML_DefaultHandler)0x0) break;
LAB_004569e1:
        reportDefault(parser,enc,(char *)local_b8,(char *)local_b0);
      }
      else {
        if (enc->isUtf8 != '\0') {
          pvVar20 = parser->m_handlerArg;
          iVar7 = (int)local_b0 - (int)local_b8;
          pTVar19 = local_b8;
          goto LAB_00456654;
        }
        while( true ) {
          local_80.str = parser->m_dataBuf;
          XVar8 = (*enc->utf8Convert)(enc,(char **)&local_b8,(char *)local_b0,&local_80.str,
                                      parser->m_dataBufEnd);
          *local_88 = (char *)local_b8;
          (*p_Var21)(parser->m_handlerArg,parser->m_dataBuf,
                     (int)local_80.str - (int)parser->m_dataBuf);
          pOVar23 = local_a8;
          if (XVar8 < XML_CONVERT_OUTPUT_EXHAUSTED) break;
          local_a8->internalEventPtr = (char *)local_b8;
        }
      }
      break;
    case 7:
      if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0)
      goto switchD_0045635d_default;
      local_80.str = (XML_Char *)CONCAT71(local_80.str._1_7_,10);
      (*parser->m_characterDataHandler)(parser->m_handlerArg,(XML_Char *)&local_80,1);
      break;
    case 8:
      if (parser->m_startCdataSectionHandler == (XML_StartCdataSectionHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,(char *)local_b8,(char *)local_b0);
        }
      }
      else {
        (*parser->m_startCdataSectionHandler)(parser->m_handlerArg);
      }
      XVar9 = doCdataSection(parser,enc,(char **)&local_b0,(char *)local_a0,nextPtr,haveMore);
      if (XVar9 != XML_ERROR_NONE) {
        return XVar9;
      }
      if (local_b0 == (TAG_NAME *)0x0) {
        parser->m_processor = cdataSectionProcessor;
        return XML_ERROR_NONE;
      }
      break;
    case 9:
      iVar7 = (*enc->predefinedEntityName)
                        (enc,(char *)((long)&local_b8->str + (long)enc->minBytesPerChar),
                         (char *)((long)local_b0 - (long)enc->minBytesPerChar));
      local_80.str = (XML_Char *)CONCAT71(local_80.str._1_7_,(char)iVar7);
      if ((char)iVar7 == '\0') {
        pXVar13 = poolStoreString(local_38,enc,
                                  (char *)((long)&local_b8->str + (long)enc->minBytesPerChar),
                                  (char *)((long)local_b0 - (long)enc->minBytesPerChar));
        pDVar6 = local_40;
        if (pXVar13 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        entity = (ENTITY *)lookup(parser,&local_40->generalEntities,pXVar13,0);
        pOVar23 = local_a8;
        (pDVar6->pool).ptr = (pDVar6->pool).start;
        if ((pDVar6->hasParamEntityRefs == '\0') || (pDVar6->standalone != '\0')) {
          if (entity == (ENTITY *)0x0) {
            return XML_ERROR_UNDEFINED_ENTITY;
          }
          if (entity->is_internal == '\0') {
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
          }
        }
        else if (entity == (ENTITY *)0x0) {
          if (parser->m_skippedEntityHandler == (XML_SkippedEntityHandler)0x0) {
            p_Var3 = parser->m_defaultHandler;
            goto joined_r0x00456c64;
          }
          (*parser->m_skippedEntityHandler)(parser->m_handlerArg,pXVar13,0);
          pOVar23 = local_a8;
          break;
        }
        if (entity->open != '\0') {
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->notation != (XML_Char *)0x0) {
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        if (entity->textPtr == (XML_Char *)0x0) {
          if (parser->m_externalEntityRefHandler == (XML_ExternalEntityRefHandler)0x0) {
LAB_00456c57:
            p_Var3 = parser->m_defaultHandler;
            goto joined_r0x00456c64;
          }
          entity->open = '\x01';
          pXVar13 = getContext(parser);
          entity->open = '\0';
          if (pXVar13 == (XML_Char *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
          iVar7 = (*parser->m_externalEntityRefHandler)
                            (parser->m_externalEntityRefHandlerArg,pXVar13,entity->base,
                             entity->systemId,entity->publicId);
          if (iVar7 == 0) {
            return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
          }
          (parser->m_tempPool).ptr = (parser->m_tempPool).start;
        }
        else if (parser->m_defaultExpandInternalEntities == '\0') {
          if (parser->m_skippedEntityHandler == (XML_SkippedEntityHandler)0x0) goto LAB_00456c57;
          (*parser->m_skippedEntityHandler)(parser->m_handlerArg,entity->name,0);
        }
        else {
          XVar9 = processInternalEntity(parser,entity,betweenDecl);
          if (XVar9 != XML_ERROR_NONE) {
            return XVar9;
          }
        }
      }
      else if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        p_Var3 = parser->m_defaultHandler;
joined_r0x00456c64:
        if (p_Var3 != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,(char *)local_b8,(char *)local_b0);
        }
      }
      else {
        (*parser->m_characterDataHandler)(parser->m_handlerArg,(XML_Char *)&local_80,1);
      }
      break;
    case 10:
      iVar7 = (*enc->charRefNumber)(enc,(char *)local_b8);
      if (iVar7 < 0) {
        return XML_ERROR_BAD_CHAR_REF;
      }
      p_Var21 = parser->m_characterDataHandler;
      if (p_Var21 == (XML_CharacterDataHandler)0x0) {
        p_Var3 = parser->m_defaultHandler;
        pOVar23 = local_a8;
        goto joined_r0x00456ad5;
      }
      pvVar20 = parser->m_handlerArg;
      iVar7 = XmlUtf8Encode(iVar7,(char *)&local_80);
      pTVar19 = &local_80;
LAB_00456654:
      (*p_Var21)(pvVar20,(XML_Char *)pTVar19,iVar7);
      pOVar23 = local_a8;
      break;
    case 0xb:
      iVar7 = reportProcessingInstruction(parser,enc,(char *)local_b8,(char *)local_b0);
      goto LAB_00456626;
    case 0xc:
      return XML_ERROR_MISPLACED_XML_PI;
    case 0xd:
      iVar7 = reportComment(parser,enc,(char *)local_b8,(char *)local_b0);
LAB_00456626:
      if (iVar7 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case -5:
      if (haveMore == '\0') {
        if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
          if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
            reportDefault(parser,enc,(char *)local_b8,(char *)local_a0);
          }
        }
        else if (enc->isUtf8 == '\0') {
          local_80.str = parser->m_dataBuf;
          (*enc->utf8Convert)(enc,(char **)&local_b8,(char *)local_a0,&local_80.str,
                              parser->m_dataBufEnd);
          (*parser->m_characterDataHandler)
                    (parser->m_handlerArg,parser->m_dataBuf,
                     (int)local_80.str - (int)parser->m_dataBuf);
        }
        else {
          (*parser->m_characterDataHandler)
                    (parser->m_handlerArg,(XML_Char *)local_b8,(int)local_a0 - (int)local_b8);
        }
        if (local_94 == 0) {
          pOVar23->internalEventPtr = (char *)local_a0;
          return XML_ERROR_NO_ELEMENTS;
        }
        local_b8 = local_a0;
        if (parser->m_tagLevel != local_94) {
          pOVar23->internalEventPtr = (char *)local_a0;
          return XML_ERROR_ASYNC_ENTITY;
        }
      }
      goto LAB_00456df2;
    case -4:
      if (haveMore == '\0') {
        if (local_94 < 1) {
          return XML_ERROR_NO_ELEMENTS;
        }
        if (parser->m_tagLevel != local_94) {
          return XML_ERROR_ASYNC_ENTITY;
        }
      }
      goto LAB_00456df2;
    case -3:
      if (haveMore == '\0') {
        *local_88 = (char *)local_a0;
        if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
          if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
            reportDefault(parser,enc,(char *)local_b8,(char *)local_a0);
          }
        }
        else {
          local_80.str = (XML_Char *)CONCAT71(local_80.str._1_7_,10);
          (*parser->m_characterDataHandler)(parser->m_handlerArg,(XML_Char *)&local_80,1);
        }
        if (local_94 == 0) {
          return XML_ERROR_NO_ELEMENTS;
        }
        local_b8 = local_a0;
        if (parser->m_tagLevel != local_94) {
          return XML_ERROR_ASYNC_ENTITY;
        }
      }
      goto LAB_00456df2;
    case -2:
      if (haveMore == '\0') {
        return XML_ERROR_PARTIAL_CHAR;
      }
      goto LAB_00456df2;
    case -1:
      if (haveMore == '\0') {
        return XML_ERROR_UNCLOSED_TOKEN;
      }
      goto LAB_00456df2;
    default:
switchD_0045635d_default:
      p_Var3 = parser->m_defaultHandler;
joined_r0x00456ad5:
      if (p_Var3 != (XML_DefaultHandler)0x0) goto LAB_004569e1;
    }
    XVar2 = (parser->m_parsingStatus).parsing;
    local_b8 = local_b0;
    pOVar23->internalEventPtr = (char *)local_b0;
    if (XVar2 == XML_FINISHED) {
      return XML_ERROR_ABORTED;
    }
    if (XVar2 == XML_SUSPENDED) {
LAB_00456df2:
      *nextPtr = (char *)local_b8;
      return XML_ERROR_NONE;
    }
  } while( true );
}

Assistant:

static enum XML_Error
doContent(XML_Parser parser,
          int startTagLevel,
          const ENCODING *enc,
          const char *s,
          const char *end,
          const char **nextPtr,
          XML_Bool haveMore)
{
  /* save one level of indirection */
  DTD * const dtd = parser->m_dtd;

  const char **eventPP;
  const char **eventEndPP;
  if (enc == parser->m_encoding) {
    eventPP = &parser->m_eventPtr;
    eventEndPP = &parser->m_eventEndPtr;
  }
  else {
    eventPP = &(parser->m_openInternalEntities->internalEventPtr);
    eventEndPP = &(parser->m_openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;

  for (;;) {
    const char *next = s; /* XmlContentTok doesn't always set the last arg */
    int tok = XmlContentTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_TRAILING_CR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      *eventEndPP = end;
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, end);
      /* We are at the end of the final buffer, should we check for
         XML_SUSPENDED, XML_FINISHED?
      */
      if (startTagLevel == 0)
        return XML_ERROR_NO_ELEMENTS;
      if (parser->m_tagLevel != startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (startTagLevel > 0) {
        if (parser->m_tagLevel != startTagLevel)
          return XML_ERROR_ASYNC_ENTITY;
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = (XML_Char) XmlPredefinedEntityName(enc,
                                              s + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (parser->m_characterDataHandler)
            parser->m_characterDataHandler(parser->m_handlerArg, &ch, 1);
          else if (parser->m_defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        name = poolStoreString(&dtd->pool, enc,
                                s + enc->minBytesPerChar,
                                next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
        poolDiscard(&dtd->pool);
        /* First, determine if a check for an existing declaration is needed;
           if yes, check that the entity exists, and that it is internal,
           otherwise call the skipped entity or default handler.
        */
        if (!dtd->hasParamEntityRefs || dtd->standalone) {
          if (!entity)
            return XML_ERROR_UNDEFINED_ENTITY;
          else if (!entity->is_internal)
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
        else if (!entity) {
          if (parser->m_skippedEntityHandler)
            parser->m_skippedEntityHandler(parser->m_handlerArg, name, 0);
          else if (parser->m_defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        if (entity->open)
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        if (entity->notation)
          return XML_ERROR_BINARY_ENTITY_REF;
        if (entity->textPtr) {
          enum XML_Error result;
          if (!parser->m_defaultExpandInternalEntities) {
            if (parser->m_skippedEntityHandler)
              parser->m_skippedEntityHandler(parser->m_handlerArg, entity->name, 0);
            else if (parser->m_defaultHandler)
              reportDefault(parser, enc, s, next);
            break;
          }
          result = processInternalEntity(parser, entity, XML_FALSE);
          if (result != XML_ERROR_NONE)
            return result;
        }
        else if (parser->m_externalEntityRefHandler) {
          const XML_Char *context;
          entity->open = XML_TRUE;
          context = getContext(parser);
          entity->open = XML_FALSE;
          if (!context)
            return XML_ERROR_NO_MEMORY;
          if (!parser->m_externalEntityRefHandler(parser->m_externalEntityRefHandlerArg,
                                        context,
                                        entity->base,
                                        entity->systemId,
                                        entity->publicId))
            return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
          poolDiscard(&parser->m_tempPool);
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        break;
      }
    case XML_TOK_START_TAG_NO_ATTS:
      /* fall through */
    case XML_TOK_START_TAG_WITH_ATTS:
      {
        TAG *tag;
        enum XML_Error result;
        XML_Char *toPtr;
        if (parser->m_freeTagList) {
          tag = parser->m_freeTagList;
          parser->m_freeTagList = parser->m_freeTagList->parent;
        }
        else {
          tag = (TAG *)MALLOC(parser, sizeof(TAG));
          if (!tag)
            return XML_ERROR_NO_MEMORY;
          tag->buf = (char *)MALLOC(parser, INIT_TAG_BUF_SIZE);
          if (!tag->buf) {
            FREE(parser, tag);
            return XML_ERROR_NO_MEMORY;
          }
          tag->bufEnd = tag->buf + INIT_TAG_BUF_SIZE;
        }
        tag->bindings = NULL;
        tag->parent = parser->m_tagStack;
        parser->m_tagStack = tag;
        tag->name.localPart = NULL;
        tag->name.prefix = NULL;
        tag->rawName = s + enc->minBytesPerChar;
        tag->rawNameLength = XmlNameLength(enc, tag->rawName);
        ++parser->m_tagLevel;
        {
          const char *rawNameEnd = tag->rawName + tag->rawNameLength;
          const char *fromPtr = tag->rawName;
          toPtr = (XML_Char *)tag->buf;
          for (;;) {
            int bufSize;
            int convLen;
            const enum XML_Convert_Result convert_res = XmlConvert(enc,
                       &fromPtr, rawNameEnd,
                       (ICHAR **)&toPtr, (ICHAR *)tag->bufEnd - 1);
            convLen = (int)(toPtr - (XML_Char *)tag->buf);
            if ((fromPtr >= rawNameEnd) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE)) {
              tag->name.strLen = convLen;
              break;
            }
            bufSize = (int)(tag->bufEnd - tag->buf) << 1;
            {
              char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
              if (temp == NULL)
                return XML_ERROR_NO_MEMORY;
              tag->buf = temp;
              tag->bufEnd = temp + bufSize;
              toPtr = (XML_Char *)temp + convLen;
            }
          }
        }
        tag->name.str = (XML_Char *)tag->buf;
        *toPtr = XML_T('\0');
        result = storeAtts(parser, enc, s, &(tag->name), &(tag->bindings));
        if (result)
          return result;
        if (parser->m_startElementHandler)
          parser->m_startElementHandler(parser->m_handlerArg, tag->name.str,
                              (const XML_Char **)parser->m_atts);
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        poolClear(&parser->m_tempPool);
        break;
      }
    case XML_TOK_EMPTY_ELEMENT_NO_ATTS:
      /* fall through */
    case XML_TOK_EMPTY_ELEMENT_WITH_ATTS:
      {
        const char *rawName = s + enc->minBytesPerChar;
        enum XML_Error result;
        BINDING *bindings = NULL;
        XML_Bool noElmHandlers = XML_TRUE;
        TAG_NAME name;
        name.str = poolStoreString(&parser->m_tempPool, enc, rawName,
                                   rawName + XmlNameLength(enc, rawName));
        if (!name.str)
          return XML_ERROR_NO_MEMORY;
        poolFinish(&parser->m_tempPool);
        result = storeAtts(parser, enc, s, &name, &bindings);
        if (result != XML_ERROR_NONE) {
          freeBindings(parser, bindings);
          return result;
        }
        poolFinish(&parser->m_tempPool);
        if (parser->m_startElementHandler) {
          parser->m_startElementHandler(parser->m_handlerArg, name.str, (const XML_Char **)parser->m_atts);
          noElmHandlers = XML_FALSE;
        }
        if (parser->m_endElementHandler) {
          if (parser->m_startElementHandler)
            *eventPP = *eventEndPP;
          parser->m_endElementHandler(parser->m_handlerArg, name.str);
          noElmHandlers = XML_FALSE;
        }
        if (noElmHandlers && parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        poolClear(&parser->m_tempPool);
        freeBindings(parser, bindings);
      }
      if ((parser->m_tagLevel == 0) && (parser->m_parsingStatus.parsing != XML_FINISHED)) {
        if (parser->m_parsingStatus.parsing == XML_SUSPENDED)
          parser->m_processor = epilogProcessor;
        else
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_END_TAG:
      if (parser->m_tagLevel == startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      else {
        int len;
        const char *rawName;
        TAG *tag = parser->m_tagStack;
        parser->m_tagStack = tag->parent;
        tag->parent = parser->m_freeTagList;
        parser->m_freeTagList = tag;
        rawName = s + enc->minBytesPerChar*2;
        len = XmlNameLength(enc, rawName);
        if (len != tag->rawNameLength
            || memcmp(tag->rawName, rawName, len) != 0) {
          *eventPP = rawName;
          return XML_ERROR_TAG_MISMATCH;
        }
        --parser->m_tagLevel;
        if (parser->m_endElementHandler) {
          const XML_Char *localPart;
          const XML_Char *prefix;
          XML_Char *uri;
          localPart = tag->name.localPart;
          if (parser->m_ns && localPart) {
            /* localPart and prefix may have been overwritten in
               tag->name.str, since this points to the binding->uri
               buffer which gets re-used; so we have to add them again
            */
            uri = (XML_Char *)tag->name.str + tag->name.uriLen;
            /* don't need to check for space - already done in storeAtts() */
            while (*localPart) *uri++ = *localPart++;
            prefix = (XML_Char *)tag->name.prefix;
            if (parser->m_ns_triplets && prefix) {
              *uri++ = parser->m_namespaceSeparator;
              while (*prefix) *uri++ = *prefix++;
             }
            *uri = XML_T('\0');
          }
          parser->m_endElementHandler(parser->m_handlerArg, tag->name.str);
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        while (tag->bindings) {
          BINDING *b = tag->bindings;
          if (parser->m_endNamespaceDeclHandler)
            parser->m_endNamespaceDeclHandler(parser->m_handlerArg, b->prefix->name);
          tag->bindings = tag->bindings->nextTagBinding;
          b->nextTagBinding = parser->m_freeBindingList;
          parser->m_freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
        if (parser->m_tagLevel == 0)
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_CHAR_REF:
      {
        int n = XmlCharRefNumber(enc, s);
        if (n < 0)
          return XML_ERROR_BAD_CHAR_REF;
        if (parser->m_characterDataHandler) {
          XML_Char buf[XML_ENCODE_MAX];
          parser->m_characterDataHandler(parser->m_handlerArg, buf, XmlEncode(n, (ICHAR *)buf));
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_XML_DECL:
      return XML_ERROR_MISPLACED_XML_PI;
    case XML_TOK_DATA_NEWLINE:
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_CDATA_SECT_OPEN:
      {
        enum XML_Error result;
        if (parser->m_startCdataSectionHandler)
          parser->m_startCdataSectionHandler(parser->m_handlerArg);
/* BEGIN disabled code */
        /* Suppose you doing a transformation on a document that involves
           changing only the character data.  You set up a defaultHandler
           and a characterDataHandler.  The defaultHandler simply copies
           characters through.  The characterDataHandler does the
           transformation and writes the characters out escaping them as
           necessary.  This case will fail to work if we leave out the
           following two lines (because & and < inside CDATA sections will
           be incorrectly escaped).

           However, now we have a start/endCdataSectionHandler, so it seems
           easier to let the user deal with this.
        */
        else if (0 && parser->m_characterDataHandler)
          parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf, 0);
/* END disabled code */
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
        result = doCdataSection(parser, enc, &next, end, nextPtr, haveMore);
        if (result != XML_ERROR_NONE)
          return result;
        else if (!next) {
          parser->m_processor = cdataSectionProcessor;
          return result;
        }
      }
      break;
    case XML_TOK_TRAILING_RSQB:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (parser->m_characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
          XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
          parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                               (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
        }
        else
          parser->m_characterDataHandler(parser->m_handlerArg,
                               (XML_Char *)s,
                               (int)((XML_Char *)end - (XML_Char *)s));
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, end);
      /* We are at the end of the final buffer, should we check for
         XML_SUSPENDED, XML_FINISHED?
      */
      if (startTagLevel == 0) {
        *eventPP = end;
        return XML_ERROR_NO_ELEMENTS;
      }
      if (parser->m_tagLevel != startTagLevel) {
        *eventPP = end;
        return XML_ERROR_ASYNC_ENTITY;
      }
      *nextPtr = end;
      return XML_ERROR_NONE;
    case XML_TOK_DATA_CHARS:
      {
        XML_CharacterDataHandler charDataHandler = parser->m_characterDataHandler;
        if (charDataHandler) {
          if (MUST_CONVERT(enc, s)) {
            for (;;) {
              ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
              const enum XML_Convert_Result convert_res = XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
              *eventEndPP = s;
              charDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                              (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
              if ((convert_res == XML_CONVERT_COMPLETED) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
                break;
              *eventPP = s;
            }
          }
          else
            charDataHandler(parser->m_handlerArg,
                            (XML_Char *)s,
                            (int)((XML_Char *)next - (XML_Char *)s));
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    default:
      /* All of the tokens produced by XmlContentTok() have their own
       * explicit cases, so this default is not strictly necessary.
       * However it is a useful safety net, so we retain the code and
       * simply exclude it from the coverage tests.
       *
       * LCOV_EXCL_START
       */
      if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
      /* LCOV_EXCL_STOP */
    }
    *eventPP = s = next;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default: ;
    }
  }
  /* not reached */
}